

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::~cmMakefile(cmMakefile *this)

{
  cmDeleteAll<std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>>
            (&this->InstallGenerators);
  cmDeleteAll<std::vector<cmTestGenerator*,std::allocator<cmTestGenerator*>>>(&this->TestGenerators)
  ;
  cmDeleteAll<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>(&this->SourceFiles);
  cmDeleteAll<std::map<std::__cxx11::string,cmTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTest*>>>>
            (&this->Tests);
  cmDeleteAll<std::vector<cmTarget*,std::allocator<cmTarget*>>>(&this->ImportedTargetsOwned);
  cmDeleteAll<std::vector<cmCommand*,std::allocator<cmCommand*>>>(&this->FinalPassCommands);
  cmDeleteAll<std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
            (&this->FunctionBlockers);
  cmDeleteAll<std::vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>>
            (&this->EvaluationFiles);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&(this->QtUiFilesWithOptions).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->OutputToSource)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->ImportedTargets)._M_h);
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base
            (&(this->ImportedTargetsOwned).
              super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>);
  std::_Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::~_Vector_base
            (&(this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>);
  std::_Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::
  ~_Vector_base(&(this->ContextStack).
                 super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>
               );
  std::
  _Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::~_Vector_base(&(this->EvaluationFiles).
                   super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                 );
  std::_Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
  ~_Vector_base(&(this->ExportBuildFileGenerators).
                 super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
               );
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&(this->UnConfiguredDirectories).
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
  cmsys::RegularExpression::~RegularExpression(&this->cmNamedCurly);
  cmsys::RegularExpression::~RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefineRegex);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->FunctionBlockerBarriers).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::~_Vector_base
            (&(this->FunctionBlockers).
              super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>);
  std::_Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>::~_Vector_base
            (&(this->FinalPassCommands).
              super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this->SourceGroups);
  std::__cxx11::string::~string((string *)&this->DefineFlagsOrig);
  std::__cxx11::string::~string((string *)&this->DefineFlags);
  std::__cxx11::string::~string((string *)&this->ComplainFileRegularExpression);
  std::_Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::~_Vector_base
            (&(this->TestGenerators).
              super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>);
  std::_Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::~_Vector_base
            (&(this->InstallGenerators).
              super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::~vector(&this->LinkLibraries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OutputFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->SystemIncludeDirectories)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->LinkDirectories);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::~_Rb_tree(&(this->Tests)._M_t);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&(this->SourceFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->AliasTargets)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->Targets)._M_h);
  std::
  _Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
  ::~_Rb_tree((_Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
               *)this);
  return;
}

Assistant:

cmMakefile::~cmMakefile()
{
  cmDeleteAll(this->InstallGenerators);
  cmDeleteAll(this->TestGenerators);
  cmDeleteAll(this->SourceFiles);
  cmDeleteAll(this->Tests);
  cmDeleteAll(this->ImportedTargetsOwned);
  cmDeleteAll(this->FinalPassCommands);
  cmDeleteAll(this->FunctionBlockers);
  cmDeleteAll(this->EvaluationFiles);
}